

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmemmgr.c
# Opt level: O0

void jinit_memory_mgr(j_common_ptr cinfo)

{
  int iVar1;
  char *pcVar2;
  j_common_ptr in_RDI;
  char ch;
  char *memenv;
  size_t test_mac;
  int pool;
  long max_to_use;
  my_mem_ptr mem;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  char cVar3;
  j_common_ptr in_stack_ffffffffffffffd0;
  int local_1c;
  long local_18;
  jpeg_memory_mgr *local_10;
  j_common_ptr local_8;
  
  in_RDI->mem = (jpeg_memory_mgr *)0x0;
  local_8 = in_RDI;
  local_18 = jpeg_mem_init(in_RDI);
  local_10 = (jpeg_memory_mgr *)
             jpeg_get_small(in_stack_ffffffffffffffd0,
                            CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  if (local_10 == (jpeg_memory_mgr *)0x0) {
    jpeg_mem_term(local_8);
    local_8->err->msg_code = 0x38;
    (local_8->err->msg_parm).i[0] = 0;
    (*local_8->err->error_exit)(local_8);
  }
  local_10->alloc_small = alloc_small;
  local_10->alloc_large = alloc_large;
  local_10->alloc_sarray = alloc_sarray;
  local_10->alloc_barray = alloc_barray;
  local_10->request_virt_sarray = request_virt_sarray;
  local_10->request_virt_barray = request_virt_barray;
  local_10->realize_virt_arrays = realize_virt_arrays;
  local_10->access_virt_sarray = access_virt_sarray;
  local_10->access_virt_barray = access_virt_barray;
  local_10->free_pool = free_pool;
  local_10->self_destruct = self_destruct;
  local_10->max_alloc_chunk = 1000000000;
  local_10->max_memory_to_use = local_18;
  for (local_1c = 1; -1 < local_1c; local_1c = local_1c + -1) {
    (&local_10[1].alloc_small)[local_1c] = (_func_void_ptr_j_common_ptr_int_size_t *)0x0;
    (&local_10[1].alloc_sarray)[local_1c] =
         (_func_JSAMPARRAY_j_common_ptr_int_JDIMENSION_JDIMENSION *)0x0;
  }
  local_10[1].request_virt_sarray =
       (_func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
  local_10[1].request_virt_barray =
       (_func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *)0x0;
  local_10[1].realize_virt_arrays = (_func_void_j_common_ptr *)0xa8;
  local_8->mem = local_10;
  pcVar2 = getenv("JPEGMEM");
  if (pcVar2 != (char *)0x0) {
    cVar3 = 'x';
    iVar1 = __isoc99_sscanf(pcVar2,"%ld%c",&local_18,&stack0xffffffffffffffcf);
    if (0 < iVar1) {
      if ((cVar3 == 'm') || (cVar3 == 'M')) {
        local_18 = local_18 * 1000;
      }
      local_10->max_memory_to_use = local_18 * 1000;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_memory_mgr (j_common_ptr cinfo)
{
  my_mem_ptr mem;
  long max_to_use;
  int pool;
  size_t test_mac;

  cinfo->mem = NULL;		/* for safety if init fails */

  /* Check for configuration errors.
   * SIZEOF(ALIGN_TYPE) should be a power of 2; otherwise, it probably
   * doesn't reflect any real hardware alignment requirement.
   * The test is a little tricky: for X>0, X and X-1 have no one-bits
   * in common if and only if X is a power of 2, ie has only one one-bit.
   * Some compilers may give an "unreachable code" warning here; ignore it.
   */
  if ((SIZEOF(ALIGN_TYPE) & (SIZEOF(ALIGN_TYPE)-1)) != 0)
    ERREXIT(cinfo, JERR_BAD_ALIGN_TYPE);
  /* MAX_ALLOC_CHUNK must be representable as type size_t, and must be
   * a multiple of SIZEOF(ALIGN_TYPE).
   * Again, an "unreachable code" warning may be ignored here.
   * But a "constant too large" warning means you need to fix MAX_ALLOC_CHUNK.
   */
  test_mac = (size_t) MAX_ALLOC_CHUNK;
  if ((long) test_mac != MAX_ALLOC_CHUNK ||
      (MAX_ALLOC_CHUNK % SIZEOF(ALIGN_TYPE)) != 0)
    ERREXIT(cinfo, JERR_BAD_ALLOC_CHUNK);

  max_to_use = jpeg_mem_init(cinfo); /* system-dependent initialization */

  /* Attempt to allocate memory manager's control block */
  mem = (my_mem_ptr) jpeg_get_small(cinfo, SIZEOF(my_memory_mgr));

  if (mem == NULL) {
    jpeg_mem_term(cinfo);	/* system-dependent cleanup */
    ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 0);
  }

  /* OK, fill in the method pointers */
  mem->pub.alloc_small = alloc_small;
  mem->pub.alloc_large = alloc_large;
  mem->pub.alloc_sarray = alloc_sarray;
  mem->pub.alloc_barray = alloc_barray;
  mem->pub.request_virt_sarray = request_virt_sarray;
  mem->pub.request_virt_barray = request_virt_barray;
  mem->pub.realize_virt_arrays = realize_virt_arrays;
  mem->pub.access_virt_sarray = access_virt_sarray;
  mem->pub.access_virt_barray = access_virt_barray;
  mem->pub.free_pool = free_pool;
  mem->pub.self_destruct = self_destruct;

  /* Make MAX_ALLOC_CHUNK accessible to other modules */
  mem->pub.max_alloc_chunk = MAX_ALLOC_CHUNK;

  /* Initialize working state */
  mem->pub.max_memory_to_use = max_to_use;

  for (pool = JPOOL_NUMPOOLS-1; pool >= JPOOL_PERMANENT; pool--) {
    mem->small_list[pool] = NULL;
    mem->large_list[pool] = NULL;
  }
  mem->virt_sarray_list = NULL;
  mem->virt_barray_list = NULL;

  mem->total_space_allocated = SIZEOF(my_memory_mgr);

  /* Declare ourselves open for business */
  cinfo->mem = & mem->pub;

  /* Check for an environment variable JPEGMEM; if found, override the
   * default max_memory setting from jpeg_mem_init.  Note that the
   * surrounding application may again override this value.
   * If your system doesn't support getenv(), define NO_GETENV to disable
   * this feature.
   */
#ifndef NO_GETENV
  { char * memenv;

    if ((memenv = getenv("JPEGMEM")) != NULL) {
      char ch = 'x';

      if (sscanf(memenv, "%ld%c", &max_to_use, &ch) > 0) {
	if (ch == 'm' || ch == 'M')
	  max_to_use *= 1000L;
	mem->pub.max_memory_to_use = max_to_use * 1000L;
      }
    }
  }
#endif

}